

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O2

bool __thiscall xercesc_4_0::DTDScanner::scanSystemLiteral(DTDScanner *this,XMLBuffer *toFill)

{
  bool bVar1;
  XMLCh toAppend;
  UnexpectedEOFException *this_00;
  XMLCh quoteCh;
  
  toFill->fIndex = 0;
  bVar1 = ReaderMgr::skipIfQuote(this->fReaderMgr,&quoteCh);
  if (bVar1) {
    while( true ) {
      toAppend = ReaderMgr::getNextChar(this->fReaderMgr);
      if (toAppend == quoteCh) break;
      if (toAppend == L'\0') {
        this_00 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
        UnexpectedEOFException::UnexpectedEOFException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/DTD/DTDScanner.cpp"
                   ,0xebf,Gen_UnexpectedEOF,this->fMemoryManager);
        __cxa_throw(this_00,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
      }
      XMLBuffer::append(toFill,toAppend);
    }
  }
  else {
    XMLScanner::emitError(this->fScanner,ExpectedQuotedString);
  }
  return bVar1;
}

Assistant:

bool DTDScanner::scanSystemLiteral(XMLBuffer& toFill)
{
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr->skipIfQuote(quoteCh)) {
        fScanner->emitError(XMLErrs::ExpectedQuotedString);
        return false;
    }

	XMLCh nextCh;
    // Break out on terminating quote
    while ((nextCh=fReaderMgr->getNextChar())!=quoteCh)
    {
        // Watch for EOF
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        toFill.append(nextCh);
    }
    return true;
}